

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

int __thiscall
Fl_Text_Buffer::outputfile(Fl_Text_Buffer *this,char *file,int start,int end,int buflen)

{
  int iVar1;
  FILE *__s;
  char *__ptr;
  size_t sVar2;
  int e;
  int r;
  char *p;
  int n;
  FILE *fp;
  int buflen_local;
  int end_local;
  int start_local;
  char *file_local;
  Fl_Text_Buffer *this_local;
  
  __s = (FILE *)fl_fopen(file,"w");
  buflen_local = start;
  if (__s == (FILE *)0x0) {
    this_local._4_4_ = 1;
  }
  else {
    while (iVar1 = min(end - buflen_local,buflen), iVar1 != 0) {
      __ptr = text_range(this,buflen_local,buflen_local + iVar1);
      sVar2 = fwrite(__ptr,1,(long)iVar1,__s);
      free(__ptr);
      if ((int)sVar2 != iVar1) break;
      buflen_local = iVar1 + buflen_local;
    }
    iVar1 = ferror(__s);
    this_local._4_4_ = 0;
    if (iVar1 != 0) {
      this_local._4_4_ = 2;
    }
    fclose(__s);
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Buffer::outputfile(const char *file,
			       int start, int end,
			       int buflen) {
  FILE *fp;
  if (!(fp = fl_fopen(file, "w")))
    return 1;
  for (int n; (n = min(end - start, buflen)); start += n) {
    const char *p = text_range(start, start + n);
    int r = (int) fwrite(p, 1, n, fp);
    free((void *) p);
    if (r != n)
      break;
  }
  
  int e = ferror(fp) ? 2 : 0;
  fclose(fp);
  return e;
}